

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dt-from-pseudo-root-dt.cpp
# Opt level: O0

Up __thiscall
yactfr::internal::DtFromPseudoRootDtConverter::_dtFromPseudoSlArrayType
          (DtFromPseudoRootDtConverter *this,PseudoDt *pseudoDt)

{
  PseudoDt *len;
  PseudoSlArrayType *in_RDX;
  undefined1 local_70 [8];
  __uniq_ptr_impl<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> local_68;
  undefined1 local_5c [12];
  PseudoDt *local_50;
  undefined1 local_48 [8];
  Up elemDt;
  PseudoSlArrayType *pseudoArrayType;
  PseudoDt *pseudoDt_local;
  DtFromPseudoRootDtConverter *this_local;
  Up *arrayType;
  
  len = PseudoArrayType::pseudoElemType(&in_RDX->super_PseudoArrayType);
  PseudoSlDtMixin::len(&in_RDX->super_PseudoSlDtMixin);
  _tryNonNtStrTypeFromPseudoArrayType<yactfr::StaticLengthStringType,yactfr::internal::PseudoSlArrayType,unsigned_long_long>
            (this,(PseudoSlArrayType *)pseudoDt,(PseudoDt *)in_RDX,(unsigned_long_long *)len);
  elemDt._M_t.
  super___uniq_ptr_impl<const_yactfr::DataType,_std::default_delete<const_yactfr::DataType>_>._M_t.
  super__Tuple_impl<0UL,_const_yactfr::DataType_*,_std::default_delete<const_yactfr::DataType>_>.
  super__Head_base<0UL,_const_yactfr::DataType_*,_false>._M_head_impl._4_1_ =
       std::unique_ptr::operator_cast_to_bool((unique_ptr *)this);
  elemDt._M_t.
  super___uniq_ptr_impl<const_yactfr::DataType,_std::default_delete<const_yactfr::DataType>_>._M_t.
  super__Tuple_impl<0UL,_const_yactfr::DataType_*,_std::default_delete<const_yactfr::DataType>_>.
  super__Head_base<0UL,_const_yactfr::DataType_*,_false>._M_head_impl._5_3_ = 0;
  if (!elemDt._M_t.
       super___uniq_ptr_impl<const_yactfr::DataType,_std::default_delete<const_yactfr::DataType>_>.
       _M_t.
       super__Tuple_impl<0UL,_const_yactfr::DataType_*,_std::default_delete<const_yactfr::DataType>_>
       .super__Head_base<0UL,_const_yactfr::DataType_*,_false>._M_head_impl._4_1_) {
    std::unique_ptr<const_yactfr::DataType,_std::default_delete<const_yactfr::DataType>_>::
    ~unique_ptr((unique_ptr<const_yactfr::DataType,_std::default_delete<const_yactfr::DataType>_> *)
                this);
  }
  if (elemDt._M_t.
      super___uniq_ptr_impl<const_yactfr::DataType,_std::default_delete<const_yactfr::DataType>_>.
      _M_t.
      super__Tuple_impl<0UL,_const_yactfr::DataType_*,_std::default_delete<const_yactfr::DataType>_>
      .super__Head_base<0UL,_const_yactfr::DataType_*,_false>._M_head_impl._4_4_ == 0) {
    local_50 = pseudoDt;
    _whileVisitingPseudoDt<yactfr::internal::PseudoSlArrayType,yactfr::internal::DtFromPseudoRootDtConverter::_dtFromPseudoSlArrayType(yactfr::internal::PseudoDt_const&)::__0>
              ((DtFromPseudoRootDtConverter *)local_48,(PseudoSlArrayType *)pseudoDt,
               (anon_class_8_1_8991fb9c *)in_RDX);
    local_5c._0_4_ = PseudoArrayType::minAlign(&in_RDX->super_PseudoArrayType);
    local_68._M_t.
    super__Tuple_impl<0UL,_const_yactfr::MapItem_*,_std::default_delete<const_yactfr::MapItem>_>.
    super__Head_base<0UL,_const_yactfr::MapItem_*,_false>._M_head_impl =
         (tuple<const_yactfr::MapItem_*,_std::default_delete<const_yactfr::MapItem>_>)
         PseudoSlDtMixin::len(&in_RDX->super_PseudoSlDtMixin);
    WithAttrsMixin::attrs(&(in_RDX->super_PseudoArrayType).super_WithAttrsMixin);
    tryCloneAttrs((MapItem *)local_70);
    PseudoSlArrayType::hasMetadataStreamUuidRole(in_RDX);
    StaticLengthArrayType::
    create<unsigned_int,std::unique_ptr<yactfr::DataType_const,std::default_delete<yactfr::DataType_const>>,unsigned_long_long,std::unique_ptr<yactfr::MapItem_const,std::default_delete<yactfr::MapItem_const>>,bool>
              ((uint *)(local_5c + 4),
               (unique_ptr<const_yactfr::DataType,_std::default_delete<const_yactfr::DataType>_> *)
               local_5c,(unsigned_long_long *)local_48,
               (unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
               &local_68,(bool *)local_70);
    std::unique_ptr<yactfr::DataType_const,std::default_delete<yactfr::DataType_const>>::
    unique_ptr<yactfr::StaticLengthArrayType_const,std::default_delete<yactfr::StaticLengthArrayType_const>,void>
              ((unique_ptr<yactfr::DataType_const,std::default_delete<yactfr::DataType_const>> *)
               this,(unique_ptr<const_yactfr::StaticLengthArrayType,_std::default_delete<const_yactfr::StaticLengthArrayType>_>
                     *)(local_5c + 4));
    std::
    unique_ptr<const_yactfr::StaticLengthArrayType,_std::default_delete<const_yactfr::StaticLengthArrayType>_>
    ::~unique_ptr((unique_ptr<const_yactfr::StaticLengthArrayType,_std::default_delete<const_yactfr::StaticLengthArrayType>_>
                   *)(local_5c + 4));
    std::unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>::~unique_ptr
              ((unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
               local_70);
    elemDt._M_t.
    super___uniq_ptr_impl<const_yactfr::DataType,_std::default_delete<const_yactfr::DataType>_>._M_t
    .super__Tuple_impl<0UL,_const_yactfr::DataType_*,_std::default_delete<const_yactfr::DataType>_>.
    super__Head_base<0UL,_const_yactfr::DataType_*,_false>._M_head_impl._4_4_ = 1;
    std::unique_ptr<const_yactfr::DataType,_std::default_delete<const_yactfr::DataType>_>::
    ~unique_ptr((unique_ptr<const_yactfr::DataType,_std::default_delete<const_yactfr::DataType>_> *)
                local_48);
  }
  return (__uniq_ptr_data<const_yactfr::DataType,_std::default_delete<const_yactfr::DataType>,_true,_true>
          )(__uniq_ptr_data<const_yactfr::DataType,_std::default_delete<const_yactfr::DataType>,_true,_true>
            )this;
}

Assistant:

DataType::Up DtFromPseudoRootDtConverter::_dtFromPseudoSlArrayType(const PseudoDt& pseudoDt)
{
    auto& pseudoArrayType = static_cast<const PseudoSlArrayType&>(pseudoDt);

    if (auto arrayType = this->_tryNonNtStrTypeFromPseudoArrayType<StaticLengthStringType>(pseudoArrayType,
                                                                                           pseudoArrayType.pseudoElemType(),
                                                                                           pseudoArrayType.len())) {
        return arrayType;
    }

    auto elemDt = this->_whileVisitingPseudoDt(pseudoArrayType, [this](auto& pseudoArrayType) {
        return this->_dtFromPseudoDt(pseudoArrayType.pseudoElemType());
    });

    return StaticLengthArrayType::create(pseudoArrayType.minAlign(), std::move(elemDt),
                                         pseudoArrayType.len(),
                                         tryCloneAttrs(pseudoArrayType.attrs()),
                                         pseudoArrayType.hasMetadataStreamUuidRole());
}